

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessingValidator.cpp
# Opt level: O0

char * CoreML::MLArrayDataType_Name(MLArrayDataType x)

{
  code *pcVar1;
  char *pcStack_10;
  MLArrayDataType x_local;
  
  if (x == MLArrayDataTypeINVALID_ARRAY_DATA_TYPE) {
    pcStack_10 = "INVALID";
  }
  else if (x == MLArrayDataTypeFLOAT32) {
    pcStack_10 = "MLArrayDataTypeFLOAT32";
  }
  else if (x == MLArrayDataTypeDOUBLE) {
    pcStack_10 = "MLArrayDataTypeDOUBLE";
  }
  else {
    if (x != MLArrayDataTypeINT32) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    pcStack_10 = "MLArrayDataTypeINT32";
  }
  return pcStack_10;
}

Assistant:

static const char * MLArrayDataType_Name(MLArrayDataType x) {
        switch (x) {
            case MLArrayDataTypeINVALID_ARRAY_DATA_TYPE:
                return "INVALID";
            case MLArrayDataTypeFLOAT32:
                return "MLArrayDataTypeFLOAT32";
            case MLArrayDataTypeDOUBLE:
                return "MLArrayDataTypeDOUBLE";
            case MLArrayDataTypeINT32:
                return "MLArrayDataTypeINT32";
        }
    }